

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O3

Token * __thiscall embree::TokenStream::next(Token *__return_storage_ptr__,TokenStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ssize_t sVar3;
  bool bVar4;
  int iVar5;
  ParseLocation *pPVar6;
  int *piVar7;
  ssize_t *psVar8;
  ParseLocation loc;
  Token local_88;
  ParseLocation local_40;
  
  paVar2 = &local_88.str.field_2;
  local_88.loc.lineNumber._0_4_ = 0xffffffff;
  local_88.loc.lineNumber._4_4_ = 0xffffffff;
  local_88.loc.colNumber._0_4_ = 0xffffffff;
  local_88.loc.colNumber._4_4_ = 0xffffffff;
  local_88.ty = TY_EOF;
  local_88.str._M_string_length = 0;
  local_88.str.field_2._M_local_buf[0] = '\0';
  local_88.loc.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_88.loc.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.str._M_dataplus._M_p = (pointer)paVar2;
  skipSeparators(this);
  pPVar6 = Stream<int>::loc((this->cin).ptr);
  local_40.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (pPVar6->fileName).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_40.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (pPVar6->fileName).
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_40.fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.fileName.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.fileName.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_40.fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_40.lineNumber = pPVar6->lineNumber;
  local_40.colNumber = pPVar6->colNumber;
  bVar4 = trySymbols(this,&local_88,&local_40);
  psVar8 = &local_88.loc.lineNumber;
  if (!bVar4) {
    bVar4 = tryFloat(this,&local_88,&local_40);
    if (!bVar4) {
      bVar4 = tryInt(this,&local_88,&local_40);
      if (!bVar4) {
        bVar4 = tryString(this,&local_88,&local_40);
        if (!bVar4) {
          bVar4 = tryIdentifier(this,&local_88,&local_40);
          if (!bVar4) {
            piVar7 = Stream<int>::peek((this->cin).ptr);
            psVar8 = &local_40.lineNumber;
            if (*piVar7 == -1) {
              __return_storage_ptr__->ty = TY_EOF;
            }
            else {
              iVar5 = Stream<int>::get((this->cin).ptr);
              __return_storage_ptr__->ty = TY_CHAR;
              (__return_storage_ptr__->field_1).c = (char)iVar5;
            }
            (__return_storage_ptr__->str)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->str).field_2;
            (__return_storage_ptr__->str)._M_string_length = 0;
            (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
            (__return_storage_ptr__->loc).fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_40.fileName.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (__return_storage_ptr__->loc).fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 local_40.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            if (local_40.fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_40.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_40.fileName.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_40.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_40.fileName.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            goto LAB_001d73f9;
          }
        }
      }
    }
  }
  __return_storage_ptr__->ty = local_88.ty;
  __return_storage_ptr__->field_1 = local_88.field_1;
  paVar1 = &(__return_storage_ptr__->str).field_2;
  (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.str._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_88.str.field_2._M_allocated_capacity._1_7_,
                  local_88.str.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->str).field_2 + 8) = local_88.str.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->str)._M_dataplus._M_p = local_88.str._M_dataplus._M_p;
    (__return_storage_ptr__->str).field_2._M_allocated_capacity =
         CONCAT71(local_88.str.field_2._M_allocated_capacity._1_7_,
                  local_88.str.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->str)._M_string_length = local_88.str._M_string_length;
  local_88.str._M_string_length = 0;
  local_88.str.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_88.loc.fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  (__return_storage_ptr__->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_88.loc.fileName.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_88.loc.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )ZEXT816(0);
  local_88.str._M_dataplus._M_p = (pointer)paVar2;
LAB_001d73f9:
  sVar3 = psVar8[1];
  (__return_storage_ptr__->loc).lineNumber = *psVar8;
  (__return_storage_ptr__->loc).colNumber = sVar3;
  if (local_40.fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.fileName.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_88.loc.fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.loc.fileName.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.str._M_dataplus._M_p != paVar2) {
    operator_delete(local_88.str._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Token TokenStream::next()
  {
    Token token;
    skipSeparators();
    ParseLocation loc = cin->loc();
    if (trySymbols   (token,loc)) return token;      /**< try to parse a symbol */
    if (tryFloat     (token,loc)) return token;      /**< try to parse float */
    if (tryInt       (token,loc)) return token;      /**< try to parse integer */
    if (tryString    (token,loc)) return token;      /**< try to parse string */
    if (tryIdentifier(token,loc)) return token;      /**< try to parse identifier */
    if (cin->peek() == EOF  )     return Token(loc); /**< return EOF token */
    return Token((char)cin->get(),loc);              /**< return invalid character token */
  }